

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vampire.cpp
# Opt level: O1

void outputClausesToLaTeX(Problem *prb)

{
  List<Kernel::Unit_*> **ppLVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  ostream *poVar4;
  ImmediateSimplificationEngine *pIVar5;
  Clause *pCVar6;
  uint index;
  LaTeX latex;
  CompositeISE simplifier;
  ClauseIterator cit;
  ofstream latexOut;
  LaTeX local_269;
  string local_268;
  undefined1 local_248 [8];
  string local_240;
  Entry *local_220;
  filebuf local_218 [240];
  ios_base local_128 [264];
  
  paVar2 = &local_268.field_2;
  local_268._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,*(long *)(Lib::env + 0x6a70),
             *(long *)(Lib::env + 0x6a78) + *(long *)(Lib::env + 0x6a70));
  std::ofstream::ofstream(&local_220,local_268._M_dataplus._M_p,_S_out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  Shell::LaTeX::header_abi_cxx11_(&local_268,&local_269);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_220,local_268._M_dataplus._M_p,local_268._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_220,"\\section{Problem ",0x11);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_220,*(char **)(Lib::env + 0x82d8),
                      *(long *)(Lib::env + 0x82e0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_220,"\\[\n\\begin{array}{ll}",0x14);
  std::ios::widen((char)(ostream *)&local_220 + (char)local_220[-2]._val);
  std::ostream::put((char)&local_220);
  std::ostream::flush();
  local_268._M_string_length = 0;
  local_268._M_dataplus._M_p = (pointer)&PTR__CompositeISE_00b657f8;
  local_268.field_2._M_allocated_capacity = 0;
  local_268.field_2._8_8_ = 0;
  pIVar5 = (ImmediateSimplificationEngine *)operator_new(0x10);
  (pIVar5->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
  (pIVar5->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
  (pIVar5->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
  (pIVar5->super_InferenceEngine)._vptr_InferenceEngine =
       (_func_int **)&PTR__InferenceEngine_00b65b18;
  Inferences::CompositeISE::addFront((CompositeISE *)&local_268,pIVar5);
  pIVar5 = (ImmediateSimplificationEngine *)operator_new(0x18);
  (pIVar5->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
  (pIVar5->super_InferenceEngine)._vptr_InferenceEngine =
       (_func_int **)&PTR__InferenceEngine_00b66888;
  *(undefined1 *)&pIVar5[1].super_InferenceEngine._vptr_InferenceEngine = 1;
  Inferences::CompositeISE::addFront((CompositeISE *)&local_268,pIVar5);
  pIVar5 = (ImmediateSimplificationEngine *)operator_new(0x10);
  (pIVar5->super_InferenceEngine)._vptr_InferenceEngine = (_func_int **)0x0;
  (pIVar5->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
  (pIVar5->super_InferenceEngine)._salg = (SaturationAlgorithm *)0x0;
  (pIVar5->super_InferenceEngine)._vptr_InferenceEngine =
       (_func_int **)&PTR__InferenceEngine_00b65a58;
  Inferences::CompositeISE::addFront((CompositeISE *)&local_268,pIVar5);
  Kernel::Problem::clauseIterator((Problem *)local_248);
  index = 0;
  while( true ) {
    cVar3 = (**(code **)&((*(Unit **)local_248)->_inference).field_0x8)();
    if (cVar3 == '\0') break;
    pCVar6 = (Clause *)(*(code *)((*(Unit **)local_248)->_inference)._splits)();
    pCVar6 = Inferences::CompositeISE::simplify((CompositeISE *)&local_268,pCVar6);
    if (pCVar6 != (Clause *)0x0) {
      outputUnitToLaTeX(&local_269,(ofstream *)&local_220,&pCVar6->super_Unit,index);
      index = index + 1;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_220,"\\end{array}\n\\]",0xe);
  Shell::LaTeX::footer_abi_cxx11_(&local_240,&local_269);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_220,local_240._M_dataplus._M_p,local_240._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if (local_248 != (undefined1  [8])0x0) {
    ppLVar1 = (List<Kernel::Unit_*> **)((long)local_248 + 8);
    *(int *)ppLVar1 = *(int *)ppLVar1 + -1;
    if (*(int *)ppLVar1 == 0) {
      (**(code **)&(*(Unit **)local_248)->_inference)();
    }
  }
  Inferences::CompositeISE::~CompositeISE((CompositeISE *)&local_268);
  local_220 = _VTT;
  *(undefined8 *)((long)&local_220 + (long)_VTT[-2]._val) = _roundf;
  std::filebuf::~filebuf(local_218);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void outputClausesToLaTeX(Problem* prb)
{
  ASS(env.options->latexOutput()!="off");

  LaTeX latex;
  ofstream latexOut(env.options->latexOutput().c_str());
  latexOut << latex.header() << endl;
  latexOut << "\\section{Problem "<<env.options->problemName() << "}" << endl;
  //TODO output more header
  latexOut << "\\[\n\\begin{array}{ll}" << endl;

  CompositeISE simplifier;
  simplifier.addFront(new TrivialInequalitiesRemovalISE());
  simplifier.addFront(new TautologyDeletionISE());
  simplifier.addFront(new DuplicateLiteralRemovalISE());

  unsigned index=0;
  ClauseIterator cit = prb->clauseIterator();
  while (cit.hasNext()) {
    Clause* cl = cit.next();
    cl = simplifier.simplify(cl);
    if (!cl) {
      continue;
    }
    outputUnitToLaTeX(latex,latexOut,cl,index++);
  }
  latexOut  << "\\end{array}\n\\]" << latex.footer() << "\n";

  //close ofstream?
}